

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

pair<unsigned_long,_unsigned_long> __thiscall
google::
sparse_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
::find_position<int>
          (sparse_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
           *this,int *key)

{
  bool bVar1;
  size_type sVar2;
  sparse_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  *in_RSI;
  size_type in_RDI;
  size_type insert_pos;
  size_type bucknum;
  size_type bucket_count_minus_one;
  size_type num_probes;
  const_reference in_stack_ffffffffffffffa8;
  sparse_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  *in_stack_ffffffffffffffb0;
  sparse_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  *this_00;
  sparse_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  *this_01;
  sparse_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  *local_38;
  ulong local_30;
  long local_28;
  sparse_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  *local_20;
  pair<unsigned_long,_unsigned_long> local_10;
  
  local_28 = 0;
  local_20 = in_RSI;
  sVar2 = bucket_count((sparse_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                        *)0x10ad426);
  local_30 = sVar2 - 1;
  sVar2 = hash<int>(in_stack_ffffffffffffffb0,&in_stack_ffffffffffffffa8->first);
  local_38 = (sparse_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
              *)(sVar2 & local_30);
  this_01 = (sparse_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
             *)0xffffffffffffffff;
  do {
    bVar1 = sparsetable<std::pair<const_int,_A>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
            ::test((sparsetable<std::pair<const_int,_A>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                    *)this_01,in_RDI);
    if (!bVar1) {
      if (this_01 ==
          (sparse_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
           *)0xffffffffffffffff) {
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_true>
                  (&local_10,
                   &sparse_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::sparse_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::sparse_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
                    ::ILLEGAL_BUCKET,(unsigned_long *)&local_38);
      }
      else {
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_true>
                  (&local_10,
                   &sparse_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::sparse_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::sparse_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
                    ::ILLEGAL_BUCKET,(unsigned_long *)&stack0xffffffffffffffc0);
      }
      return local_10;
    }
    bVar1 = test_deleted(this_01,in_RDI);
    if (bVar1) {
      if (this_01 ==
          (sparse_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
           *)0xffffffffffffffff) {
        this_01 = local_38;
      }
    }
    else {
      this_00 = local_20;
      sparsetable<std::pair<const_int,_A>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
      ::unsafe_get((sparsetable<std::pair<const_int,_A>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                    *)this_01,in_RDI);
      get_key(this_00,in_stack_ffffffffffffffa8);
      bVar1 = sparse_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::sparse_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::sparse_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
              ::equals<int,int>(this_00,&in_stack_ffffffffffffffa8->first,(int *)0x10ad50b);
      if (bVar1) {
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_true>
                  (&local_10,(unsigned_long *)&local_38,
                   &sparse_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::sparse_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::sparse_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
                    ::ILLEGAL_BUCKET);
        return local_10;
      }
    }
    local_28 = local_28 + 1;
    local_38 = (sparse_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::sparse_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                *)((long)&(((_Vector_impl *)
                           &(local_38->settings).
                            super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
                            enlarge_threshold_)->super__Vector_impl_data)._M_start + local_28 &
                  local_30);
  } while( true );
}

Assistant:

std::pair<size_type, size_type> find_position(const K& key) const {
    size_type num_probes = 0;  // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = hash(key) & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    SPARSEHASH_STAT_UPDATE(total_lookups += 1);
    while (1) {                    // probe until something happens
      if (!table.test(bucknum)) {  // bucket is empty
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        if (insert_pos == ILLEGAL_BUCKET)  // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);
      } else if (test_deleted(bucknum)) {  // keep searching, but mark to insert
        if (insert_pos == ILLEGAL_BUCKET) insert_pos = bucknum;
      } else if (equals(key, get_key(table.unsafe_get(bucknum)))) {
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;  // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count() &&
             "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }